

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cc
# Opt level: O0

unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> __thiscall
flow::lang::Parser::powExpr(Parser *this)

{
  Report *this_00;
  bool bVar1;
  Token TVar2;
  LiteralType args;
  LiteralType args_2;
  SourceLocation *pSVar3;
  pointer pEVar4;
  pointer right;
  Parser *in_RSI;
  unique_ptr<flow::lang::BinaryExpr,_std::default_delete<flow::lang::BinaryExpr>_> local_a8;
  allocator<char> local_99;
  string local_98;
  undefined1 local_72 [8];
  Opcode opc;
  unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> rhs;
  undefined1 local_58 [8];
  unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> lhs;
  SourceLocation sloc;
  Parser *this_local;
  
  pSVar3 = location(in_RSI);
  SourceLocation::SourceLocation((SourceLocation *)&lhs,pSVar3);
  negExpr((Parser *)local_58);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_58);
  if (bVar1) {
    do {
      TVar2 = token(in_RSI);
      if (TVar2 != Pow) {
        std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>::unique_ptr
                  ((unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)this,
                   (unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)local_58)
        ;
        rhs._M_t.super___uniq_ptr_impl<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>.
        _M_t.super__Tuple_impl<0UL,_flow::lang::Expr_*,_std::default_delete<flow::lang::Expr>_>.
        super__Head_base<0UL,_flow::lang::Expr_*,_false>._M_head_impl._0_4_ = 1;
        break;
      }
      nextToken(in_RSI);
      powExpr((Parser *)(local_72 + 2));
      bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)(local_72 + 2));
      if (bVar1) {
        pEVar4 = std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>::get
                           ((unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)
                            local_58);
        right = std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>::get
                          ((unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)
                           (local_72 + 2));
        local_72._0_2_ = makeOperator(Pow,pEVar4,right);
        if (local_72._0_2_ == EXIT) {
          this_00 = in_RSI->report_;
          pSVar3 = lastLocation(in_RSI);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_98,"Incompatible binary expression operands ({} {} {}).",
                     &local_99);
          pEVar4 = std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>::
                   operator->((unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>
                               *)local_58);
          args = (*(pEVar4->super_ASTNode)._vptr_ASTNode[3])();
          pEVar4 = std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>::
                   operator->((unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>
                               *)(local_72 + 2));
          args_2 = (*(pEVar4->super_ASTNode)._vptr_ASTNode[3])();
          diagnostics::Report::typeError<flow::LiteralType,flow::lang::Token,flow::LiteralType>
                    (this_00,pSVar3,&local_98,args,Pow,args_2);
          std::__cxx11::string::~string((string *)&local_98);
          std::allocator<char>::~allocator(&local_99);
          std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>::
          unique_ptr<std::default_delete<flow::lang::Expr>,void>
                    ((unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>> *)this,
                     (nullptr_t)0x0);
          rhs._M_t.super___uniq_ptr_impl<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>.
          _M_t.super__Tuple_impl<0UL,_flow::lang::Expr_*,_std::default_delete<flow::lang::Expr>_>.
          super__Head_base<0UL,_flow::lang::Expr_*,_false>._M_head_impl._0_4_ = 1;
        }
        else {
          std::
          make_unique<flow::lang::BinaryExpr,flow::Opcode&,std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>,std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>>
                    ((Opcode *)&local_a8,
                     (unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)
                     local_72,(unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>
                               *)local_58);
          std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>::operator=
                    ((unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>> *)local_58,
                     &local_a8);
          std::unique_ptr<flow::lang::BinaryExpr,_std::default_delete<flow::lang::BinaryExpr>_>::
          ~unique_ptr(&local_a8);
          rhs._M_t.super___uniq_ptr_impl<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>.
          _M_t.super__Tuple_impl<0UL,_flow::lang::Expr_*,_std::default_delete<flow::lang::Expr>_>.
          super__Head_base<0UL,_flow::lang::Expr_*,_false>._M_head_impl._0_4_ = 0;
        }
      }
      else {
        std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>::
        unique_ptr<std::default_delete<flow::lang::Expr>,void>
                  ((unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>> *)this,
                   (nullptr_t)0x0);
        rhs._M_t.super___uniq_ptr_impl<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>.
        _M_t.super__Tuple_impl<0UL,_flow::lang::Expr_*,_std::default_delete<flow::lang::Expr>_>.
        super__Head_base<0UL,_flow::lang::Expr_*,_false>._M_head_impl._0_4_ = 1;
      }
      std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>::~unique_ptr
                ((unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)
                 (local_72 + 2));
    } while ((int)rhs._M_t.
                  super___uniq_ptr_impl<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_flow::lang::Expr_*,_std::default_delete<flow::lang::Expr>_>
                  .super__Head_base<0UL,_flow::lang::Expr_*,_false>._M_head_impl == 0);
  }
  else {
    std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>::
    unique_ptr<std::default_delete<flow::lang::Expr>,void>
              ((unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>> *)this,
               (nullptr_t)0x0);
    rhs._M_t.super___uniq_ptr_impl<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>._M_t.
    super__Tuple_impl<0UL,_flow::lang::Expr_*,_std::default_delete<flow::lang::Expr>_>.
    super__Head_base<0UL,_flow::lang::Expr_*,_false>._M_head_impl._0_4_ = 1;
  }
  std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>::~unique_ptr
            ((unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)local_58);
  SourceLocation::~SourceLocation((SourceLocation *)&lhs);
  return (__uniq_ptr_data<flow::lang::Expr,_std::default_delete<flow::lang::Expr>,_true,_true>)
         (__uniq_ptr_data<flow::lang::Expr,_std::default_delete<flow::lang::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::powExpr() {
  // powExpr ::= negExpr ('**' powExpr)*
  SourceLocation sloc(location());
  std::unique_ptr<Expr> lhs = negExpr();
  if (!lhs) return nullptr;

  while (token() == Token::Pow) {
    nextToken();

    std::unique_ptr<Expr> rhs = powExpr();
    if (!rhs) return nullptr;

    auto opc = makeOperator(Token::Pow, lhs.get(), rhs.get());
    if (opc == Opcode::EXIT) {
      report_.typeError(
          lastLocation(),
          "Incompatible binary expression operands ({} {} {}).",
          lhs->getType(), Token::Pow, rhs->getType());
      return nullptr;
    }

    lhs = std::make_unique<BinaryExpr>(opc, std::move(lhs), std::move(rhs));
  }

  return lhs;
}